

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

int check_type_union_leafref(lys_type *type)

{
  lys_type_bit *plVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  
  if ((type->base == LY_TYPE_UNION) && (uVar3 = (type->info).bits.count, uVar3 != 0)) {
    plVar1 = (type->info).bits.bit;
    bVar4 = 0;
    do {
      iVar2 = *(int *)((long)plVar1 + (ulong)bVar4 * 0x40);
      if (iVar2 == 0xb) {
        iVar2 = check_type_union_leafref((lys_type *)((ulong)bVar4 * 0x40 + (long)plVar1));
        if (iVar2 != 0) {
          return 1;
        }
      }
      else if (iVar2 == 9) {
        return 1;
      }
      bVar4 = bVar4 + 1;
    } while (bVar4 < uVar3);
    uVar3 = 0;
  }
  else {
    uVar3 = (uint)type->der->has_union_leafref;
  }
  return uVar3;
}

Assistant:

static int
check_type_union_leafref(struct lys_type *type)
{
    uint8_t i;

    if ((type->base == LY_TYPE_UNION) && type->info.uni.count) {
        /* go through unions and look for leafref */
        for (i = 0; i < type->info.uni.count; ++i) {
            switch (type->info.uni.types[i].base) {
            case LY_TYPE_LEAFREF:
                return 1;
            case LY_TYPE_UNION:
                if (check_type_union_leafref(&type->info.uni.types[i])) {
                    return 1;
                }
                break;
            default:
                break;
            }
        }

        return 0;
    }

    /* just inherit the flag value */
    return type->der->has_union_leafref;
}